

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_insert(fy_node *fyn_to,fy_node *fyn_from)

{
  undefined1 *puVar1;
  byte *pbVar2;
  fy_document *fyd;
  list_head *plVar3;
  long lVar4;
  byte bVar5;
  _Bool _Var6;
  int iVar7;
  fy_node *pfVar8;
  fy_node *pfVar9;
  list_head *plVar10;
  list_head *plVar11;
  fy_token *pfVar12;
  byte bVar13;
  int iVar14;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar15;
  fy_token *pfVar16;
  char *pcVar17;
  
  iVar7 = -1;
  if (fyn_to == (fy_node *)0x0) {
    return -1;
  }
  fyd = fyn_to->fyd;
  if (fyd == (fy_document *)0x0) {
    return -1;
  }
  pfVar9 = fyn_to->parent;
  if (pfVar9 == (fy_node *)0x0) goto LAB_0011f349;
  bVar5 = pfVar9->field_0x34 & 3;
  if (bVar5 == 0) {
    pcVar17 = "Illegal scalar parent node type";
    iVar14 = 0x7f9;
LAB_0011f5b5:
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,iVar14,"fy_node_insert",pcVar17);
    return iVar7;
  }
  if (fyn_from == (fy_node *)0x0) {
    pcVar17 = "Illegal NULL source node";
    iVar14 = 0x7fc;
    goto LAB_0011f5b5;
  }
  if (bVar5 == 2) {
    pfVar12 = (pfVar9->field_12).scalar;
    if (pfVar12 == (fy_token *)0x0 || pfVar12 == (fy_token *)&pfVar9->field_12) goto LAB_0011f349;
    do {
      pfVar16 = pfVar12;
      if (*(fy_node **)&pfVar12->analyze_flags == fyn_to) break;
      pfVar12 = (fy_token *)(pfVar12->node).next;
      if (pfVar12 == (fy_token *)&pfVar9->field_12) {
        pfVar12 = (fy_token *)0x0;
      }
      pfVar16 = (fy_token *)0x0;
    } while (pfVar12 != (fy_token *)0x0);
  }
  else {
LAB_0011f349:
    pfVar16 = (fy_token *)0x0;
  }
  if ((pfVar9 == (fy_node *)0x0) && (fyd->root != fyn_to)) {
    __assert_fail("fyn_parent || fyn_to == fyd->root",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                  ,0x809,"int fy_node_insert(struct fy_node *, struct fy_node *)");
  }
  if (fyn_from == (fy_node *)0x0) {
    fyn_to->parent = (fy_node *)0x0;
    if (pfVar9 == (fy_node *)0x0) {
      fy_document_diag(fyd,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x810,"fy_node_insert","Deleting root node");
      fy_node_detach_and_free(fyn_to);
      fyd->root = (fy_node *)0x0;
      return 0;
    }
    if ((pfVar9->field_0x34 & 3) == 1) {
      fy_document_diag(fyd,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x814,"fy_node_insert","Deleting sequence node");
      if (fyn_to != (fy_node *)0x0) {
        plVar11 = (fyn_to->node).next;
        plVar10 = (fyn_to->node).prev;
        plVar11->prev = plVar10;
        plVar10->next = plVar11;
        (fyn_to->node).next = (list_head *)0x0;
        (fyn_to->node).prev = (list_head *)0x0;
        (fyn_to->node).next = &fyn_to->node;
        (fyn_to->node).prev = &fyn_to->node;
      }
      fy_node_detach_and_free(fyn_to);
      return 0;
    }
    fy_document_diag(fyd,0x40,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x818,"fy_node_insert","Deleting mapping node");
    if ((pfVar9->field_0x34 & 3) != 2) {
      __assert_fail("fyn_parent->type == FYNT_MAPPING",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                    ,0x81a,"int fy_node_insert(struct fy_node *, struct fy_node *)");
    }
    if (pfVar16 != (fy_token *)0x0) {
      plVar11 = (pfVar16->node).next;
      plVar10 = (pfVar16->node).prev;
      plVar11->prev = plVar10;
      plVar10->next = plVar11;
      (pfVar16->node).next = (list_head *)0x0;
      (pfVar16->node).prev = (list_head *)0x0;
      (pfVar16->node).next = &pfVar16->node;
      (pfVar16->node).prev = &pfVar16->node;
      if (pfVar9->xl != (fy_accel *)0x0) {
        fy_accel_remove(pfVar9->xl,*(void **)&pfVar16->type);
      }
      fy_node_pair_detach_and_free((fy_node_pair *)pfVar16);
      return 0;
    }
    pcVar17 = "Illegal mapping node found";
    iVar7 = 0x81d;
  }
  else {
    bVar13 = fyn_from->field_0x34 & 3;
    bVar5 = fyn_to->field_0x34 & 3;
    if (bVar13 != 0 && bVar13 == bVar5) {
      if (bVar5 == 1) {
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x86b,"fy_node_insert","Appending to sequence node");
        pfVar12 = (fyn_from->field_12).scalar;
        if (pfVar12 != (fy_token *)0x0 && pfVar12 != (fy_token *)&fyn_from->field_12) {
          do {
            pfVar9 = fy_node_copy_internal(fyd,(fy_node *)pfVar12,(fy_node *)0x0);
            if (pfVar9 == (fy_node *)0x0) {
              puVar1 = &fyd->diag->field_0x3c;
              *puVar1 = *puVar1 & 0xfe;
              pfVar9 = (fy_node *)0x0;
            }
            if (pfVar9 == (fy_node *)0x0) {
              pcVar17 = "fy_node_copy() failed";
              iVar7 = 0x872;
              goto LAB_0011fb89;
            }
            plVar11 = (fyn_to->field_12).sequence._lh.prev;
            (fyn_to->field_12).sequence._lh.prev = &pfVar9->node;
            (pfVar9->node).next = (list_head *)&fyn_to->field_12;
            (pfVar9->node).prev = plVar11;
            plVar11->next = &pfVar9->node;
            pfVar9->field_0x34 = pfVar9->field_0x34 | 8;
            pfVar16 = (fy_token *)(pfVar12->node).next;
            pfVar12 = (fy_token *)0x0;
            if (pfVar16 != (fy_token *)&fyn_from->field_12) {
              pfVar12 = pfVar16;
            }
          } while (pfVar12 != (fy_token *)0x0);
        }
      }
      else {
        pfVar12 = (fyn_from->field_12).scalar;
        if (pfVar12 != (fy_token *)0x0 && pfVar12 != (fy_token *)&fyn_from->field_12) {
          paVar15 = &fyn_to->field_12;
          do {
            if (fyn_to->xl == (fy_accel *)0x0) {
              plVar11 = (paVar15->sequence)._lh.next;
              if (plVar11 == (list_head *)0x0 || plVar11 == (list_head *)paVar15) {
                plVar10 = (list_head *)0x0;
              }
              else {
                do {
                  plVar10 = plVar11;
                  _Var6 = fy_node_compare_user
                                    (*(fy_node **)&pfVar12->type,(fy_node *)plVar10[1].next,
                                     (fy_node_mapping_sort_fn)0x0,(void *)0x0,
                                     (fy_node_scalar_compare_fn)0x0,(void *)0x0);
                  if (_Var6) break;
                  plVar11 = plVar10->next;
                  if (plVar11 == (list_head *)paVar15) {
                    plVar11 = (list_head *)0x0;
                  }
                  plVar10 = (list_head *)0x0;
                } while (plVar11 != (list_head *)0x0);
              }
            }
            else {
              plVar10 = (list_head *)fy_accel_lookup(fyn_to->xl,*(void **)&pfVar12->type);
            }
            if (plVar10 == (list_head *)0x0) {
              fy_document_diag(fyd,0x40,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                               ,0x88b,"fy_node_insert","Appending to mapping node");
              plVar11 = (list_head *)malloc(0x30);
              if (plVar11 == (list_head *)0x0) {
                plVar11 = (list_head *)0x0;
              }
              else {
                plVar11[1].next = (list_head *)0x0;
                plVar11[1].prev = (list_head *)0x0;
                plVar11[2].next = &fyd->node;
              }
              if (plVar11 == (list_head *)0x0) {
                pcVar17 = "fy_node_pair_alloc() failed";
                iVar7 = 0x890;
                goto LAB_0011fb89;
              }
              pfVar9 = fy_node_copy_internal(fyd,*(fy_node **)&pfVar12->type,(fy_node *)0x0);
              if (pfVar9 == (fy_node *)0x0) {
                puVar1 = &fyd->diag->field_0x3c;
                *puVar1 = *puVar1 & 0xfe;
                pfVar9 = (fy_node *)0x0;
              }
              plVar11[1].next = &pfVar9->node;
              if ((pfVar9 == (fy_node *)0x0) &&
                 (lVar4._0_4_ = pfVar12->type, lVar4._4_4_ = pfVar12->refs, lVar4 != 0)) {
                pcVar17 = "fy_node_copy() failed";
                iVar7 = 0x894;
                goto LAB_0011fb89;
              }
              pfVar9 = fy_node_copy_internal
                                 (fyd,*(fy_node **)&pfVar12->analyze_flags,(fy_node *)0x0);
              if (pfVar9 == (fy_node *)0x0) {
                puVar1 = &fyd->diag->field_0x3c;
                *puVar1 = *puVar1 & 0xfe;
                pfVar9 = (fy_node *)0x0;
              }
              plVar11[1].prev = &pfVar9->node;
              if ((pfVar9 == (fy_node *)0x0) && (*(long *)&pfVar12->analyze_flags != 0)) {
                pcVar17 = "fy_node_copy() failed";
                iVar7 = 0x897;
                goto LAB_0011fb89;
              }
              plVar10 = (fyn_to->field_12).sequence._lh.prev;
              (fyn_to->field_12).sequence._lh.prev = plVar11;
              plVar11->next = (list_head *)paVar15;
              plVar11->prev = plVar10;
              plVar10->next = plVar11;
              if (fyn_to->xl != (fy_accel *)0x0) {
                fy_accel_insert(fyn_to->xl,plVar11[1].next,plVar11);
              }
              if (plVar11[1].next != (list_head *)0x0) {
                pbVar2 = (byte *)((long)&plVar11[1].next[3].next + 4);
                *pbVar2 = *pbVar2 | 8;
              }
              if (plVar11[1].prev != (list_head *)0x0) {
                pbVar2 = (byte *)((long)&plVar11[1].prev[3].next + 4);
                *pbVar2 = *pbVar2 | 8;
              }
            }
            else {
              fy_document_diag(fyd,0x40,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                               ,0x8a3,"fy_node_insert","Updating mapping node value (deep merge)");
              iVar7 = fy_node_insert((fy_node *)plVar10[1].prev,*(fy_node **)&pfVar12->analyze_flags
                                    );
              if (iVar7 != 0) {
                pcVar17 = "fy_node_insert() failed";
                iVar14 = 0x8a7;
                goto LAB_0011f5b5;
              }
            }
            pfVar16 = (fy_token *)(pfVar12->node).next;
            pfVar12 = (fy_token *)0x0;
            if (pfVar16 != (fy_token *)&fyn_from->field_12) {
              pfVar12 = pfVar16;
            }
          } while (pfVar12 != (fy_token *)0x0);
        }
      }
      bVar5 = fyn_to->field_0x34 & 3;
      if (bVar5 == 2) {
        pfVar12 = (fyn_to->field_12).scalar;
        if (pfVar12 != (fy_token *)0x0 && pfVar12 != (fy_token *)&fyn_to->field_12) {
          do {
            pfVar16 = (fy_token *)(pfVar12->node).next;
            if (pfVar16 == (fy_token *)&fyn_to->field_12) {
              pfVar16 = (fy_token *)0x0;
            }
            if (*(long *)&pfVar12->type != 0) {
              *(undefined8 *)(*(long *)&pfVar12->type + 0x20) = 0;
            }
            if (*(long *)&pfVar12->analyze_flags != 0) {
              *(fy_node **)(*(long *)&pfVar12->analyze_flags + 0x20) = fyn_to;
            }
            pfVar12->text = (char *)fyn_to;
            pfVar12 = pfVar16;
          } while (pfVar16 != (fy_token *)0x0);
        }
      }
      else if (bVar5 == 1) {
        pfVar12 = (fyn_to->field_12).scalar;
        if (pfVar12 != (fy_token *)0x0 && pfVar12 != (fy_token *)&fyn_to->field_12) {
          do {
            pfVar12->text_len = (size_t)fyn_to;
            pfVar12 = (fy_token *)(pfVar12->node).next;
            if (pfVar12 == (fy_token *)&fyn_to->field_12) {
              pfVar12 = (fy_token *)0x0;
            }
          } while (pfVar12 != (fy_token *)0x0);
        }
      }
      if (fyn_to->fyd != fyn_from->fyd) {
        iVar7 = fy_document_state_merge(fyn_to->fyd->fyds,fyn_from->fyd->fyds);
        if (iVar7 == 0) {
          iVar7 = fy_document_node_update_tags(fyd,fyd->root);
          if (iVar7 == 0) {
            return 0;
          }
          pcVar17 = "fy_document_node_update_tags() failed";
          iVar14 = 0x8cf;
        }
        else {
          pcVar17 = "fy_document_state_merge() failed";
          iVar14 = 0x8cb;
        }
        fy_document_diag(fyd,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,iVar14,"fy_node_insert",pcVar17);
        return iVar7;
      }
      return 0;
    }
    pfVar8 = fy_node_copy_internal(fyd,fyn_from,(fy_node *)0x0);
    if (pfVar8 == (fy_node *)0x0) {
      puVar1 = &fyd->diag->field_0x3c;
      *puVar1 = *puVar1 & 0xfe;
      pfVar8 = (fy_node *)0x0;
    }
    if (pfVar8 != (fy_node *)0x0) {
      if (pfVar9 == (fy_node *)0x0) {
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x848,"fy_node_insert","Replacing root node");
        fy_node_detach_and_free(fyd->root);
        fyd->root = pfVar8;
        return 0;
      }
      if ((pfVar9->field_0x34 & 3) == 1) {
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x84c,"fy_node_insert","Replacing sequence node");
        paVar15 = &pfVar9->field_12;
        plVar11 = (fyn_to->node).prev;
        plVar10 = (list_head *)0x0;
        if (plVar11 != (list_head *)paVar15) {
          plVar10 = plVar11;
        }
        if (fyn_to != (fy_node *)0x0) {
          plVar3 = (fyn_to->node).next;
          plVar3->prev = plVar11;
          plVar11->next = plVar3;
          (fyn_to->node).next = (list_head *)0x0;
          (fyn_to->node).prev = (list_head *)0x0;
          (fyn_to->node).next = &fyn_to->node;
          (fyn_to->node).prev = &fyn_to->node;
        }
        fy_node_detach_and_free(fyn_to);
        if (plVar10 == (list_head *)0x0) {
          plVar11 = (paVar15->sequence)._lh.next;
          plVar11->prev = &pfVar8->node;
          (pfVar8->node).next = plVar11;
          (pfVar8->node).prev = (list_head *)paVar15;
          (paVar15->sequence)._lh.next = &pfVar8->node;
        }
        else {
          plVar11 = plVar10->next;
          plVar11->prev = &pfVar8->node;
          (pfVar8->node).next = plVar11;
          (pfVar8->node).prev = plVar10;
          plVar10->next = &pfVar8->node;
        }
      }
      else {
        fy_document_diag(fyd,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x85b,"fy_node_insert","Replacing mapping node value");
        if ((pfVar9->field_0x34 & 3) != 2) {
          __assert_fail("fyn_parent->type == FYNT_MAPPING",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                        ,0x85d,"int fy_node_insert(struct fy_node *, struct fy_node *)");
        }
        if (pfVar16 == (fy_token *)0x0) {
          pcVar17 = "Illegal mapping node found";
          iVar7 = 0x85f;
          goto LAB_0011fb89;
        }
        fy_node_detach_and_free(*(fy_node **)&pfVar16->analyze_flags);
        *(fy_node **)&pfVar16->analyze_flags = pfVar8;
      }
      return 0;
    }
    pcVar17 = "fy_node_copy() failed";
    iVar7 = 0x845;
  }
LAB_0011fb89:
  fy_document_diag(fyd,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,iVar7,"fy_node_insert",pcVar17);
  return -1;
}

Assistant:

int fy_node_insert(struct fy_node *fyn_to, struct fy_node *fyn_from) {
    struct fy_document *fyd;
    struct fy_node *fyn_parent, *fyn_cpy, *fyni, *fyn_prev;
    struct fy_node_pair *fynp, *fynpi, *fynpj;
    int rc;

    if (!fyn_to || !fyn_to->fyd)
        return -1;

    fyd = fyn_to->fyd;
    assert(fyd);

    fyn_parent = fyn_to->parent;
    fynp = NULL;
    if (fyn_parent) {
        fyd_error_check(fyd, fyn_parent->type != FYNT_SCALAR, err_out,
                        "Illegal scalar parent node type");

        fyd_error_check(fyd, fyn_from, err_out,
                        "Illegal NULL source node");

        if (fyn_parent->type == FYNT_MAPPING) {
            /* find mapping pair that contains the `to` node */
            for (fynp = fy_node_pair_list_head(&fyn_parent->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn_parent->mapping, fynp)) {
                if (fynp->value == fyn_to)
                    break;
            }
        }
    }

    /* verify no funkiness on root */
    assert(fyn_parent || fyn_to == fyd->root);

    /* deleting target */
    if (!fyn_from) {
        fyn_to->parent = NULL;

        if (!fyn_parent) {
            fyd_doc_debug(fyd, "Deleting root node");
            fy_node_detach_and_free(fyn_to);
            fyd->root = NULL;
        } else if (fyn_parent->type == FYNT_SEQUENCE) {
            fyd_doc_debug(fyd, "Deleting sequence node");
            fy_node_list_del(&fyn_parent->sequence, fyn_to);
            fy_node_detach_and_free(fyn_to);
        } else {
            fyd_doc_debug(fyd, "Deleting mapping node");
            /* should never happen, it's checked right above, but play safe */
            assert(fyn_parent->type == FYNT_MAPPING);

            fyd_error_check(fyd, fynp, err_out,
                            "Illegal mapping node found");

            fy_node_pair_list_del(&fyn_parent->mapping, fynp);
            if (fyn_parent->xl)
                fy_accel_remove(fyn_parent->xl, fynp->key);
            /* this will also delete fyn_to */
            fy_node_pair_detach_and_free(fynp);
        }
        return 0;
    }

    /*
	 * from: scalar
	 *
	 * to: another-scalar -> scalar
	 * to: { key: value } -> scalar
	 * to: [ seq0, seq1 ] -> scalar
	 *
	 * from: [ seq2 ]
	 * to: scalar -> [ seq2 ]
	 * to: { key: value } -> [ seq2 ]
	 * to: [ seq0, seq1 ] -> [ seq0, seq1, sec2 ]
	 *
	 * from: { another-key: another-value }
	 * to: scalar -> { another-key: another-value }
	 * to: { key: value } -> { key: value, another-key: another-value }
	 * to: [ seq0, seq1 ] -> { another-key: another-value }
	 *
	 * from: { key: another-value }
	 * to: scalar -> { key: another-value }
	 * to: { key: value } -> { key: another-value }
	 * to: [ seq0, seq1 ] -> { key: another-value }
	 *
	 */

    /* if types of `from` and `to` differ (or it's a scalar), it's a replace */
    if (fyn_from->type != fyn_to->type || fyn_from->type == FYNT_SCALAR) {

        fyn_cpy = fy_node_copy(fyd, fyn_from);
        fyd_error_check(fyd, fyn_cpy, err_out,
                        "fy_node_copy() failed");

        if (!fyn_parent) {
            fyd_doc_debug(fyd, "Replacing root node");
            fy_node_detach_and_free(fyd->root);
            fyd->root = fyn_cpy;
        } else if (fyn_parent->type == FYNT_SEQUENCE) {
            fyd_doc_debug(fyd, "Replacing sequence node");

            /* get previous */
            fyn_prev = fy_node_prev(&fyn_parent->sequence, fyn_to);

            /* delete */
            fy_node_list_del(&fyn_parent->sequence, fyn_to);
            fy_node_detach_and_free(fyn_to);

            /* if there's no previous insert to head */
            if (!fyn_prev)
                fy_node_list_add(&fyn_parent->sequence, fyn_cpy);
            else
                fy_node_list_insert_after(&fyn_parent->sequence, fyn_prev, fyn_cpy);
        } else {
            fyd_doc_debug(fyd, "Replacing mapping node value");
            /* should never happen, it's checked right above, but play safe */
            assert(fyn_parent->type == FYNT_MAPPING);
            fyd_error_check(fyd, fynp, err_out,
                            "Illegal mapping node found");

            fy_node_detach_and_free(fynp->value);
            fynp->value = fyn_cpy;
        }

        return 0;
    }

    /* types match, if it's a sequence append */
    if (fyn_to->type == FYNT_SEQUENCE) {

        fyd_doc_debug(fyd, "Appending to sequence node");

        for (fyni = fy_node_list_head(&fyn_from->sequence); fyni;
             fyni = fy_node_next(&fyn_from->sequence, fyni)) {

            fyn_cpy = fy_node_copy(fyd, fyni);
            fyd_error_check(fyd, fyn_cpy, err_out,
                            "fy_node_copy() failed");

            fy_node_list_add_tail(&fyn_to->sequence, fyn_cpy);
            fyn_cpy->attached = true;
        }
    } else {
        /* only mapping is possible here */

        /* iterate over all the keys in the `from` */
        for (fynpi = fy_node_pair_list_head(&fyn_from->mapping); fynpi;
             fynpi = fy_node_pair_next(&fyn_from->mapping, fynpi)) {

            if (fyn_to->xl) {
                fynpj = fy_node_accel_lookup_by_node(fyn_to, fynpi->key);
            } else {
                /* find whether the key already exists */
                for (fynpj = fy_node_pair_list_head(&fyn_to->mapping); fynpj;
                     fynpj = fy_node_pair_next(&fyn_to->mapping, fynpj)) {

                    if (fy_node_compare(fynpi->key, fynpj->key))
                        break;
                }
            }

            if (!fynpj) {
                fyd_doc_debug(fyd, "Appending to mapping node");

                /* not found? append it */
                fynpj = fy_node_pair_alloc(fyd);
                fyd_error_check(fyd, fynpj, err_out,
                                "fy_node_pair_alloc() failed");

                fynpj->key = fy_node_copy(fyd, fynpi->key);
                fyd_error_check(fyd, !fynpi->key || fynpj->key, err_out,
                                "fy_node_copy() failed");
                fynpj->value = fy_node_copy(fyd, fynpi->value);
                fyd_error_check(fyd, !fynpi->value || fynpj->value, err_out,
                                "fy_node_copy() failed");

                fy_node_pair_list_add_tail(&fyn_to->mapping, fynpj);
                if (fyn_to->xl)
                    fy_accel_insert(fyn_to->xl, fynpj->key, fynpj);

                if (fynpj->key)
                    fynpj->key->attached = true;
                if (fynpj->value)
                    fynpj->value->attached = true;

            } else {
                fyd_doc_debug(fyd, "Updating mapping node value (deep merge)");

                rc = fy_node_insert(fynpj->value, fynpi->value);
                fyd_error_check(fyd, !rc, err_out_rc,
                                "fy_node_insert() failed");
            }
        }
    }

    /* adjust parents */
    switch (fyn_to->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn_to->sequence); fyni;
                 fyni = fy_node_next(&fyn_to->sequence, fyni)) {

                fyni->parent = fyn_to;
            }
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn_to->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn_to->mapping, fynp);

                if (fynp->key)
                    fynp->key->parent = NULL;
                if (fynp->value)
                    fynp->value->parent = fyn_to;
                fynp->parent = fyn_to;
            }
            break;
    }

    /* if the documents differ, merge their states */
    if (fyn_to->fyd != fyn_from->fyd) {
        rc = fy_document_state_merge(fyn_to->fyd->fyds, fyn_from->fyd->fyds);
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_document_state_merge() failed");

        rc = fy_document_node_update_tags(fyd, fy_document_root(fyd));
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_document_node_update_tags() failed");
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}